

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeSelect(OptimizeInstructions *this,Select *curr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  Id IVar4;
  Index IVar5;
  BinaryOp BVar6;
  uint uVar7;
  Expression *pEVar8;
  Drop *pDVar9;
  EffectAnalyzer *pEVar10;
  Unary *pUVar11;
  Const *pCVar12;
  undefined1 auVar13 [8];
  _Head_base<0UL,_wasm::DylinkSection_*,_false> right;
  undefined1 auVar14 [16];
  undefined1 local_4f0 [8];
  Expression *c_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  Module *local_4d8;
  undefined1 local_4c8 [8];
  Const *c_1;
  __node_base local_4b8;
  Module *local_4b0;
  float local_4a8;
  undefined4 uStack_4a4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
  *pMStack_4a0;
  undefined1 local_358 [8];
  EffectAnalyzer value;
  undefined1 local_1d8 [8];
  int32_t cond;
  Module *local_1c8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *local_1c0;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
  *local_1b8;
  undefined1 local_1a8 [8];
  Expression *ifFalse_1;
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_180 [72];
  undefined1 local_138 [40];
  pointer puStack_110;
  undefined1 local_f0 [8];
  Expression *ifFalse;
  undefined8 local_e0;
  Matcher<wasm::Match::Internal::ExactKind<int>_> local_d0;
  undefined1 local_a8 [8];
  Expression *ifTrue;
  _Head_base<0UL,_wasm::DylinkSection_*,_false> local_98;
  Module *local_90;
  pointer local_88;
  pointer local_80;
  Id local_5c;
  undefined1 local_58 [8];
  Expression *x;
  Type local_48;
  Builder builder;
  _Head_base<0UL,_wasm::Tag_*,_false> local_38;
  Expression *y;
  
  pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                 *)_local_4a8;
  value._36_4_ = SUB84((ulong)value.module >> 0x20,0);
  local_48.id = (uintptr_t)
                (this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .
                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                .currModule;
  pEVar8 = optimizeBoolean(this,curr->condition);
  curr->condition = pEVar8;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_180._0_8_ = local_f0;
  value._24_12_ = ZEXT812(0);
  local_358 = (undefined1  [8])0x0;
  local_4c8 = (undefined1  [8])0x0;
  local_4b8._M_nxt = (_Hash_node_base *)local_138;
  local_4b0 = (Module *)local_180;
  local_138._0_8_ = (Module *)local_a8;
  local_138._8_8_ = this;
  builder.wasm = (Module *)this;
  _local_4a8 = (Module *)local_358;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
    return (Expression *)local_f0;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  value._24_12_ = ZEXT812(0);
  local_358 = (undefined1  [8])0x0;
  local_4c8 = (undefined1  [8])0x0;
  local_180._0_8_ = local_f0;
  local_4b8._M_nxt = (_Hash_node_base *)local_138;
  local_4b0 = (Module *)local_180;
  local_138._0_8_ = (Module *)local_a8;
  _local_4a8 = (Module *)local_358;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
    pDVar9 = Builder::makeDrop((Builder *)&local_48,(Expression *)local_a8);
    right._M_head_impl = (DylinkSection *)local_f0;
    goto LAB_008f9d90;
  }
  local_138._0_8_ = local_f0;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_358 = (undefined1  [8])0x0;
  local_4c8 = (undefined1  [8])0x0;
  local_138._8_8_ = builder.wasm;
  local_4b8._M_nxt = (_Hash_node_base *)local_180;
  local_4b0 = (Module *)local_138;
  local_180._0_8_ = (Module *)local_a8;
  value.module = (Module *)local_1d8;
  _local_4a8 = (Module *)local_358;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::PureMatcherKind<wasm::OptimizeInstructions>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
    if (local_1d8._0_4_ == 0) {
      __assert_fail("cond != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0xa1f,"Expression *wasm::OptimizeInstructions::optimizeSelect(Select *)");
    }
    return (Expression *)local_a8;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  value._24_12_ = ZEXT812(0);
  local_358 = (undefined1  [8])0x0;
  local_180._0_8_ = &stack0xffffffffffffffc8;
  local_4c8 = (undefined1  [8])0x0;
  local_4b8._M_nxt = (_Hash_node_base *)local_138;
  local_4b0 = (Module *)local_358;
  local_138._0_8_ = (Function *)local_58;
  _local_4a8 = (Module *)local_180;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if ((bVar3) &&
     (bVar3 = areConsecutiveInputsEqualAndFoldable
                        ((OptimizeInstructions *)builder.wasm,(Expression *)local_58,
                         (Expression *)local_38._M_head_impl), bVar3)) {
    return (Expression *)(EffectAnalyzer *)curr->ifTrue;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  value._24_12_ = ZEXT812(0);
  local_358 = (undefined1  [8])0x0;
  local_4c8 = (undefined1  [8])0x0;
  local_180._0_8_ = &stack0xffffffffffffffc8;
  local_4b8._M_nxt = (_Hash_node_base *)local_358;
  local_4b0 = (Module *)local_138;
  local_138._0_8_ = (Function *)local_58;
  _local_4a8 = (Module *)local_180;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if ((bVar3) &&
     (bVar3 = areConsecutiveInputsEqualAndFoldable
                        ((OptimizeInstructions *)builder.wasm,(Expression *)local_58,
                         (Expression *)local_38._M_head_impl), bVar3)) {
    pDVar9 = Builder::makeDrop((Builder *)&local_48,(Expression *)local_58);
    right._M_head_impl = (DylinkSection *)curr->ifTrue;
    goto LAB_008f9d90;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_358 = (undefined1  [8])0x0;
  value.module = (Module *)0x0;
  value.features.features = 0;
  value.branchesOut = false;
  value.calls = false;
  value._38_2_ = 0;
  local_e0 = local_1a8;
  local_1a8 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_f0 = (undefined1  [8])0x0;
  ifFalse._0_4_ = 0x15;
  local_4c8 = (undefined1  [8])0x0;
  local_4b0 = (Module *)local_1d8;
  _local_4a8 = (Module *)local_f0;
  local_4b8._M_nxt = (_Hash_node_base *)local_358;
  local_1d8 = (undefined1  [8])local_58;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
LAB_008fa02a:
    bVar3 = areConsecutiveInputsEqualAndFoldable
                      ((OptimizeInstructions *)builder.wasm,(Expression *)local_58,
                       (Expression *)local_38._M_head_impl);
    if (bVar3) {
      return (Expression *)(EffectAnalyzer *)(&curr->ifTrue)[curr->condition->_id == UnaryId];
    }
  }
  else {
    local_4b8._M_nxt = (_Hash_node_base *)0x0;
    local_180._16_8_ = local_4f0;
    local_4c8 = (undefined1  [8])0x0;
    local_138._16_8_ =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)0x0;
    local_4a8 = 0.0;
    uStack_4a4 = 0;
    pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                   *)0x0;
    local_138._0_8_ = (Module *)0x0;
    local_98._M_head_impl =
         (DylinkSection *)&value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_a8 = (undefined1  [8])0x0;
    value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&stack0xffffffffffffffc8;
    stack0xfffffffffffffee8 =
         (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          )0x0;
    ifTrue._0_4_ = 0x29;
    local_180._0_8_ = (pointer)0x0;
    local_180._32_8_ = local_a8;
    local_4f0 = (undefined1  [8])local_58;
    local_180._24_8_ =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)local_4c8;
    local_90 = (Module *)local_138;
    bVar3 = Match::Internal::
            Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
            ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                       *)local_180,(candidate_t<wasm::Select_*>)curr);
    if (bVar3) goto LAB_008fa02a;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_358 = (undefined1  [8])0x0;
  value.module = (Module *)0x0;
  value.features.features = 0;
  value.branchesOut = false;
  value.calls = false;
  value._38_2_ = 0;
  local_1a8 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_f0 = (undefined1  [8])0x0;
  ifFalse._0_4_ = 0x15;
  local_4c8 = (undefined1  [8])0x0;
  local_e0 = local_1a8;
  local_4b8._M_nxt = (_Hash_node_base *)local_1d8;
  _local_4a8 = (Module *)local_f0;
  local_4b0 = (Module *)local_358;
  local_1d8 = (undefined1  [8])local_58;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)local_4c8,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
LAB_008fa175:
    bVar3 = areConsecutiveInputsEqualAndFoldable
                      ((OptimizeInstructions *)builder.wasm,(Expression *)local_58,
                       (Expression *)local_38._M_head_impl);
    if (bVar3) {
      pDVar9 = Builder::makeDrop((Builder *)&local_48,(Expression *)local_58);
      right._M_head_impl = (DylinkSection *)(&curr->ifTrue)[curr->condition->_id == UnaryId];
LAB_008f9d90:
      pEVar10 = (EffectAnalyzer *)
                Builder::makeSequence
                          ((Builder *)&local_48,(Expression *)pDVar9,
                           (Expression *)right._M_head_impl);
      return (Expression *)pEVar10;
    }
  }
  else {
    local_4b8._M_nxt = (_Hash_node_base *)0x0;
    local_4c8 = (undefined1  [8])0x0;
    _local_4a8 = (Module *)0x0;
    pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                   *)0x0;
    local_180._24_8_ = local_4f0;
    local_138._16_8_ =
         (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
          *)0x0;
    local_138._0_8_ = (Module *)0x0;
    local_98._M_head_impl =
         (DylinkSection *)&value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_a8 = (undefined1  [8])0x0;
    value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&stack0xffffffffffffffc8;
    stack0xfffffffffffffee8 =
         (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          )0x0;
    ifTrue._0_4_ = 0x29;
    local_180._0_8_ = (pointer)0x0;
    local_180._16_8_ = local_4c8;
    local_180._32_8_ = local_a8;
    local_4f0 = (undefined1  [8])local_58;
    local_90 = (Module *)local_138;
    bVar3 = Match::Internal::
            Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
            ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                       *)local_180,(candidate_t<wasm::Select_*>)curr);
    if (bVar3) goto LAB_008fa175;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_358 = (undefined1  [8])0x0;
  local_4b8._M_nxt = (_Hash_node_base *)0x0;
  value.module = (Module *)0x0;
  value.features.features = 0;
  value.branchesOut = false;
  value.calls = false;
  value._38_2_ = 0;
  _local_4a8 = (Module *)0x0;
  pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                 *)0x1;
  local_4c8 = (undefined1  [8])0x0;
  local_138._0_8_ = (pointer)0x0;
  local_180._0_8_ = (pointer)local_a8;
  local_138._16_8_ = (Module *)local_358;
  local_138._24_8_ =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_4c8;
  local_138._32_8_ =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
        *)local_180;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)local_138,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
    pUVar11 = Builder::makeUnary((Builder *)&local_48,EqZInt32,(Expression *)local_a8);
    local_a8 = (undefined1  [8])
               optimizeBoolean((OptimizeInstructions *)builder.wasm,(Expression *)pUVar11);
LAB_008fa2d9:
    bVar3 = Properties::emitsBoolean((Expression *)local_a8);
    if (!bVar3) {
      pUVar11 = Builder::makeUnary((Builder *)&local_48,EqZInt32,(Expression *)local_a8);
      local_a8 = (undefined1  [8])
                 Builder::makeUnary((Builder *)&local_48,EqZInt32,(Expression *)pUVar11);
    }
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id == 3) {
      local_a8 = (undefined1  [8])
                 Builder::makeUnary((Builder *)&local_48,ExtendUInt32,(Expression *)local_a8);
    }
    return (Expression *)(_Head_base<0UL,_wasm::DylinkSection_*,_false>)local_a8;
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  value.module = (Module *)0x0;
  value.features.features = 1;
  value.branchesOut = false;
  value.calls = false;
  value._38_2_ = 0;
  local_358 = (undefined1  [8])0x0;
  local_4b8._M_nxt = (_Hash_node_base *)0x0;
  local_4c8 = (undefined1  [8])0x0;
  _local_4a8 = (Module *)0x0;
  pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                 *)0x0;
  local_138._0_8_ = (pointer)0x0;
  local_180._0_8_ = (pointer)local_a8;
  local_138._16_8_ = (Module *)local_358;
  local_138._24_8_ =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
        *)local_4c8;
  local_138._32_8_ =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
        *)local_180;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)local_138,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) goto LAB_008fa2d9;
  pEVar8 = curr->condition;
  if ((pEVar8->_id == BinaryId) &&
     (IVar4 = invertBinaryOp((OptimizeInstructions *)builder.wasm,pEVar8[1]._id), IVar4 != 0xcb)) {
    local_358 = (undefined1  [8])0x0;
    value.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    value.module = (Module *)0x0;
    value.features.features = 0;
    value.branchesOut = false;
    value.calls = false;
    value._38_2_ = 0;
    local_5c = IVar4;
    bVar3 = Match::Internal::
            Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
            ::matches((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                       *)local_358,curr->ifTrue);
    if (bVar3) {
      local_358 = (undefined1  [8])0x0;
      value.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      value.module = (Module *)0x0;
      value.features.features = 0;
      value.branchesOut = false;
      value.calls = false;
      value._38_2_ = 0;
      bVar3 = Match::Internal::
              Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
              ::matches((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                         *)local_358,curr->ifFalse);
      if (bVar3) goto LAB_008fa3ac;
LAB_008fa40a:
      pEVar8[1]._id = local_5c;
      uVar1 = curr->ifTrue;
      uVar2 = curr->ifFalse;
      auVar14._8_4_ = (int)uVar1;
      auVar14._0_8_ = uVar2;
      auVar14._12_4_ = (int)((ulong)uVar1 >> 0x20);
      curr->ifTrue = (Expression *)uVar2;
      curr->ifFalse = (Expression *)auVar14._8_8_;
    }
    else {
LAB_008fa3ac:
      local_358 = (undefined1  [8])0x0;
      value.funcEffectsMap.
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      value.module = (Module *)0x0;
      bVar3 = Match::Internal::
              Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              ::matches((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                         *)local_358,curr->ifTrue);
      if (!bVar3) {
        local_358 = (undefined1  [8])local_4c8;
        value.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        value.module = (Module *)0x0;
        bVar3 = Match::Internal::
                Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                ::matches((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                           *)local_358,curr->ifFalse);
        if ((bVar3) && (bVar3 = Literal::isZero((Literal *)((long)local_4c8 + 0x10)), !bVar3))
        goto LAB_008fa40a;
      }
    }
  }
  if (((((curr->super_SpecificExpression<(wasm::Expression::Id)17>).super_Expression.type.id == 2)
       && (IVar5 = Bits::getMaxBits<wasm::OptimizeInstructions>
                             (curr->condition,(OptimizeInstructions *)builder.wasm), IVar5 < 2)) &&
      (IVar5 = Bits::getMaxBits<wasm::OptimizeInstructions>
                         (curr->ifTrue,(OptimizeInstructions *)builder.wasm), IVar5 < 2)) &&
     (IVar5 = Bits::getMaxBits<wasm::OptimizeInstructions>
                        (curr->ifFalse,(OptimizeInstructions *)builder.wasm), IVar5 < 2)) {
    value.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_358 = (undefined1  [8])0x0;
    local_138._0_8_ = local_f0;
    value.module = (Module *)0x0;
    value.features.features = 0;
    value.branchesOut = false;
    value.calls = false;
    value._38_2_ = 0;
    local_4c8 = (undefined1  [8])0x0;
    local_4b8._M_nxt = (_Hash_node_base *)local_138;
    local_4b0 = (Module *)local_358;
    local_180._0_8_ = (pointer)local_a8;
    _local_4a8 = (Module *)local_180;
    bVar3 = Match::Internal::
            Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                       *)local_4c8,(candidate_t<wasm::Select_*>)curr);
    if (bVar3) {
      BVar6 = AndInt32;
      auVar13 = local_a8;
      local_38._M_head_impl = (Tag *)local_f0;
      goto LAB_008fa7b7;
    }
    value.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    value.module = (Module *)0x0;
    value.features.features = 1;
    value.branchesOut = false;
    value.calls = false;
    value._38_2_ = 0;
    local_358 = (undefined1  [8])0x0;
    local_138._0_8_ = local_f0;
    local_4c8 = (undefined1  [8])0x0;
    local_4b8._M_nxt = (_Hash_node_base *)local_358;
    local_4b0 = (Module *)local_138;
    local_180._0_8_ = (pointer)local_a8;
    _local_4a8 = (Module *)local_180;
    bVar3 = Match::Internal::
            Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                       *)local_4c8,(candidate_t<wasm::Select_*>)curr);
    if (bVar3) {
      BVar6 = OrInt32;
      auVar13 = local_a8;
      local_38._M_head_impl = (Tag *)local_f0;
      goto LAB_008fa7b7;
    }
  }
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  value.module = (Module *)0x0;
  value.features.features = 0xffffffff;
  value.branchesOut = true;
  value.calls = true;
  value._38_2_ = 0xffff;
  local_358 = (undefined1  [8])0x0;
  local_4b8._M_nxt = (_Hash_node_base *)0x0;
  _local_4a8 = (Module *)0x0;
  pMStack_4a0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
                 *)0x1;
  local_4c8 = (undefined1  [8])0x0;
  local_198 = &value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  value.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138._16_8_ = (Module *)0x0;
  local_138._0_8_ = (pointer)0x0;
  local_138._32_8_ =
       (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<int>_>_>_>
        *)0x0;
  puStack_110 = (pointer)0x0;
  ifFalse_1._0_4_ = 0x16;
  local_180._0_8_ = (pointer)0x0;
  local_180._24_8_ = local_4c8;
  local_180._32_8_ = local_1a8;
  local_1a8 = (undefined1  [8])&stack0xffffffffffffffc8;
  local_190 = (Module *)local_138;
  local_180._16_8_ = (Module *)local_358;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                     *)local_180,(candidate_t<wasm::Select_*>)curr);
  if (bVar3) {
LAB_008fa6e0:
    pCVar12 = Expression::cast<wasm::Const>
                        (*(Expression **)
                          &((local_38._M_head_impl)->super_Importable).module.super_IString.str.
                           _M_str);
    local_4c8 = (undefined1  [8])(curr->ifTrue->type).id;
    if (local_4c8 ==
        (undefined1  [8])
        (pCVar12->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id) {
      (((shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>_>
         *)((long)local_38._M_head_impl + 8))->
      super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_4c8;
      BVar6 = Abstract::getBinary((Type)local_4c8,ShrS);
      *(BinaryOp *)
       &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_38._M_head_impl + 0x10))->_M_pi
           = BVar6;
      uVar7 = wasm::Type::getByteSize((Type *)local_4c8);
      Literal::makeFromInt32((Literal *)local_358,uVar7 * 8 + -1,(Type)local_4c8);
      Literal::operator=(&pCVar12->value,(Literal *)local_358);
      Literal::~Literal((Literal *)local_358);
      Literal::makeOne((Literal *)local_358,(Type)local_4c8);
      pCVar12 = Expression::cast<wasm::Const>(curr->ifTrue);
      Literal::operator=(&pCVar12->value,(Literal *)local_358);
      Literal::~Literal((Literal *)local_358);
      BVar6 = Abstract::getBinary((Type)local_4c8,Or);
      auVar13 = (undefined1  [8])curr->ifTrue;
LAB_008fa7b7:
      pEVar10 = (EffectAnalyzer *)
                Builder::makeBinary((Builder *)&local_48,BVar6,(Expression *)local_38._M_head_impl,
                                    (Expression *)auVar13);
      return (Expression *)pEVar10;
    }
  }
  else {
    local_180._16_8_ = (Module *)0x0;
    local_180._32_8_ =
         (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I64LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
          *)0x0;
    local_180._40_8_ = (pointer)0x1;
    local_180._0_8_ = (pointer)0x0;
    local_98._M_head_impl = (DylinkSection *)0x0;
    local_88 = (pointer)0x0;
    local_80 = (pointer)0xffffffffffffffff;
    local_a8 = (undefined1  [8])0x0;
    local_58 = (undefined1  [8])0x0;
    local_e0 = (pointer)0x0;
    local_f0 = (undefined1  [8])0x0;
    local_d0.binder = (matched_t<wasm::Match::Internal::ExactKind<int>_> *)0x0;
    local_d0.data = 0;
    local_d0._12_4_ = 0;
    local_1b8 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
                 *)local_4f0;
    c_2._0_4_ = 0x1c;
    local_4e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
    local_1d8 = (undefined1  [8])0x0;
    local_4d8 = (Module *)local_f0;
    local_1c0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
                 *)local_a8;
    local_4f0 = (undefined1  [8])&stack0xffffffffffffffc8;
    local_1c8 = (Module *)local_180;
    bVar3 = Match::Internal::
            Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
            ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>_&>
                       *)local_1d8,(candidate_t<wasm::Select_*>)curr);
    if (bVar3) goto LAB_008fa6e0;
  }
  local_138._0_8_ = local_1d8;
  local_180._0_8_ = local_1a8;
  local_a8 = (undefined1  [8])local_4f0;
  local_4c8 = (undefined1  [8])0x0;
  c_1._0_4_ = 0x14;
  value.module = (Module *)local_4c8;
  local_4b8._M_nxt = (_Hash_node_base *)local_a8;
  local_358 = (undefined1  [8])local_f0;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_138;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                     *)local_358,(candidate_t<wasm::Select_*>)curr);
  if ((bVar3) &&
     (bVar3 = canReorder((OptimizeInstructions *)builder.wasm,(Expression *)local_1d8,
                         (Expression *)local_1a8), bVar3)) {
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_f0 + 0x10))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8;
    (((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_f0 + 0x18))->
    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_1d8;
    *(undefined1 (*) [8])
     &(((vector<wasm::Name,_std::allocator<wasm::Name>_> *)((long)local_f0 + 0x18))->
      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>)._M_impl.super__Vector_impl_data.
      _M_finish = local_4f0;
    return (Expression *)local_f0;
  }
  local_358 = (undefined1  [8])0x0;
  local_180._0_8_ = local_1d8;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_4c8;
  value.module = (Module *)local_180;
  local_4c8 = (undefined1  [8])local_a8;
  value.funcEffectsMap.
  super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138;
  local_138._0_8_ = (element_type *)local_f0;
  bVar3 = Match::Internal::
          Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          ::matches((Matcher<wasm::Select_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                     *)local_358,(candidate_t<wasm::Select_*>)curr);
  if (!bVar3) {
    return (Expression *)(EffectAnalyzer *)0x0;
  }
  bVar3 = ExpressionAnalyzer::equal((Expression *)local_a8,(Expression *)local_f0);
  if (!bVar3) {
    return (Expression *)(EffectAnalyzer *)0x0;
  }
  effects((EffectAnalyzer *)local_358,(OptimizeInstructions *)builder.wasm,(Expression *)local_a8);
  bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_358);
  if (bVar3) {
    bVar3 = true;
    auVar13 = (undefined1  [8])local_358;
    goto LAB_008fa990;
  }
  effects((EffectAnalyzer *)local_4c8,(OptimizeInstructions *)builder.wasm,(Expression *)local_1d8);
  bVar3 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_4c8);
  auVar13 = local_a8;
  if (bVar3) {
    bVar3 = EffectAnalyzer::invalidates((EffectAnalyzer *)local_4c8,(EffectAnalyzer *)local_358);
    if (!bVar3) {
      pDVar9 = Builder::makeDrop((Builder *)&local_48,(Expression *)local_1d8);
      auVar13 = (undefined1  [8])
                Builder::makeSequence
                          ((Builder *)&local_48,(Expression *)pDVar9,(Expression *)local_a8);
      goto LAB_008fa981;
    }
    bVar3 = true;
    auVar13 = (undefined1  [8])local_358;
  }
  else {
LAB_008fa981:
    bVar3 = false;
  }
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_4c8);
LAB_008fa990:
  EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_358);
  if (bVar3) {
    return (Expression *)(EffectAnalyzer *)0x0;
  }
  return (Expression *)auVar13;
}

Assistant:

Expression* optimizeSelect(Select* curr) {
    using namespace Match;
    using namespace Abstract;
    Builder builder(*getModule());
    curr->condition = optimizeBoolean(curr->condition);
    {
      // Constant condition, we can just pick the correct side (barring side
      // effects)
      Expression *ifTrue, *ifFalse;
      if (matches(curr, select(pure(&ifTrue), any(&ifFalse), i32(0)))) {
        return ifFalse;
      }
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), i32(0)))) {
        return builder.makeSequence(builder.makeDrop(ifTrue), ifFalse);
      }
      int32_t cond;
      if (matches(curr, select(any(&ifTrue), pure(&ifFalse), i32(&cond)))) {
        // The condition must be non-zero because a zero would have matched one
        // of the previous patterns.
        assert(cond != 0);
        return ifTrue;
      }
      // Don't bother when `ifFalse` isn't pure - we would need to reverse the
      // order using a temp local, which would be bad
    }
    {
      // TODO: Remove this after landing SCCP pass. See: #4161

      // i32(x) ? i32(x) : 0  ==>  x
      Expression *x, *y;
      if (matches(curr, select(any(&x), i32(0), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->ifTrue;
      }
      // i32(x) ? 0 : i32(x)  ==>  { x, 0 }
      if (matches(curr, select(i32(0), any(&x), any(&y))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(builder.makeDrop(x), curr->ifTrue);
      }

      // i64(x) == 0 ? 0 : i64(x)  ==>  x
      // i64(x) != 0 ? i64(x) : 0  ==>  x
      if ((matches(curr, select(i64(0), any(&x), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(any(&x), i64(0), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue;
      }

      // i64(x) == 0 ? i64(x) : 0  ==>  { x, 0 }
      // i64(x) != 0 ? 0 : i64(x)  ==>  { x, 0 }
      if ((matches(curr, select(any(&x), i64(0), unary(EqZInt64, any(&y)))) ||
           matches(
             curr,
             select(i64(0), any(&x), binary(NeInt64, any(&y), i64(0))))) &&
          areConsecutiveInputsEqualAndFoldable(x, y)) {
        return builder.makeSequence(
          builder.makeDrop(x),
          curr->condition->is<Unary>() ? curr->ifFalse : curr->ifTrue);
      }
    }
    {
      // Simplify selects between 0 and 1
      Expression* c;
      bool reversed = matches(curr, select(ival(0), ival(1), any(&c)));
      if (reversed || matches(curr, select(ival(1), ival(0), any(&c)))) {
        if (reversed) {
          c = optimizeBoolean(builder.makeUnary(EqZInt32, c));
        }
        if (!Properties::emitsBoolean(c)) {
          // cond ? 1 : 0 ==> !!cond
          c = builder.makeUnary(EqZInt32, builder.makeUnary(EqZInt32, c));
        }
        return curr->type == Type::i64 ? builder.makeUnary(ExtendUInt32, c) : c;
      }
    }
    // Flip the arms if doing so might help later optimizations here.
    if (auto* binary = curr->condition->dynCast<Binary>()) {
      auto inv = invertBinaryOp(binary->op);
      if (inv != InvalidBinary) {
        // For invertible binary operations, we prefer to have non-zero values
        // in the ifTrue, and zero values in the ifFalse, due to the
        // optimization right after us. Even if this does not help there, it is
        // a nice canonicalization. (To ensure convergence - that we don't keep
        // doing work each time we get here - do nothing if both are zero, or
        // if both are nonzero.)
        Const* c;
        if ((matches(curr->ifTrue, ival(0)) &&
             !matches(curr->ifFalse, ival(0))) ||
            (!matches(curr->ifTrue, ival()) &&
             matches(curr->ifFalse, ival(&c)) && !c->value.isZero())) {
          binary->op = inv;
          std::swap(curr->ifTrue, curr->ifFalse);
        }
      }
    }
    if (curr->type == Type::i32 &&
        Bits::getMaxBits(curr->condition, this) <= 1 &&
        Bits::getMaxBits(curr->ifTrue, this) <= 1 &&
        Bits::getMaxBits(curr->ifFalse, this) <= 1) {
      // The condition and both arms are i32 booleans, which allows us to do
      // boolean optimizations.
      Expression* x;
      Expression* y;

      // x ? y : 0   ==>   x & y
      if (matches(curr, select(any(&y), ival(0), any(&x)))) {
        return builder.makeBinary(AndInt32, y, x);
      }

      // x ? 1 : y   ==>   x | y
      if (matches(curr, select(ival(1), any(&y), any(&x)))) {
        return builder.makeBinary(OrInt32, y, x);
      }
    }
    {
      // Simplify x < 0 ? -1 : 1 or x >= 0 ? 1 : -1 to
      // i32(x) >> 31 | 1
      // i64(x) >> 63 | 1
      Binary* bin;
      if (matches(
            curr,
            select(ival(-1), ival(1), binary(&bin, LtS, any(), ival(0)))) ||
          matches(
            curr,
            select(ival(1), ival(-1), binary(&bin, GeS, any(), ival(0))))) {
        auto c = bin->right->cast<Const>();
        auto type = curr->ifTrue->type;
        if (type == c->type) {
          bin->type = type;
          bin->op = Abstract::getBinary(type, ShrS);
          c->value = Literal::makeFromInt32(type.getByteSize() * 8 - 1, type);
          curr->ifTrue->cast<Const>()->value = Literal::makeOne(type);
          return builder.makeBinary(
            Abstract::getBinary(type, Or), bin, curr->ifTrue);
        }
      }
    }
    {
      // Flip select to remove eqz if we can reorder
      Select* s;
      Expression *ifTrue, *ifFalse, *c;
      if (matches(
            curr,
            select(
              &s, any(&ifTrue), any(&ifFalse), unary(EqZInt32, any(&c)))) &&
          canReorder(ifTrue, ifFalse)) {
        s->ifTrue = ifFalse;
        s->ifFalse = ifTrue;
        s->condition = c;
        return s;
      }
    }
    {
      // Sides are identical, fold
      Expression *ifTrue, *ifFalse, *c;
      if (matches(curr, select(any(&ifTrue), any(&ifFalse), any(&c))) &&
          ExpressionAnalyzer::equal(ifTrue, ifFalse)) {
        auto value = effects(ifTrue);
        if (value.hasSideEffects()) {
          // At best we don't need the condition, but need to execute the
          // value twice. a block is larger than a select by 2 bytes, and we
          // must drop one value, so 3, while we save the condition, so it's
          // not clear this is worth it, TODO
        } else {
          // The value has no side effects, so we can replace ourselves with one
          // of the two identical values in the arms.
          auto condition = effects(c);
          if (!condition.hasSideEffects()) {
            return ifTrue;
          } else {
            // The condition is last, so we need a new local, and it may be a
            // bad idea to use a block like we do for an if. Do it only if we
            // can reorder
            if (!condition.invalidates(value)) {
              return builder.makeSequence(builder.makeDrop(c), ifTrue);
            }
          }
        }
      }
    }
    return nullptr;
  }